

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::Dirty::add(Dirty *this,Literal p,WatchList *wl,Constraint *c)

{
  bool bVar1;
  size_type sVar2;
  left_iterator pCVar3;
  Dirty *in_RCX;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_RDX;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_RDI;
  uintp o;
  left_type *in_stack_ffffffffffffffb8;
  ClauseHead *this_00;
  uintp in_stack_ffffffffffffffd0;
  ClauseHead *list;
  bool local_1;
  
  sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                    (in_RDX);
  if (sVar2 < 5) {
    local_1 = false;
  }
  else {
    sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_size
                      (in_RDX);
    if (sVar2 == 0) {
      this_00 = (ClauseHead *)0x0;
    }
    else {
      pCVar3 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
                         ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1f3af6);
      this_00 = pCVar3->head;
    }
    list = this_00;
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin(in_RDI);
    std::reverse_iterator<Clasp::GenericWatch_*>::operator->
              ((reverse_iterator<Clasp::GenericWatch_*> *)this_00);
    bVar1 = add<Clasp::Constraint>
                      (in_RCX,(Constraint **)list,in_stack_ffffffffffffffd0,(Constraint *)in_RDI);
    if (bVar1) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::push_left
                ((left_right_rep<Clasp::Literal,_unsigned_int> *)this_00,in_stack_ffffffffffffffb8);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool add(Literal p, WatchList& wl, Constraint* c) {
		if (wl.right_size() <= min_size) { return false; }
		uintp o = wl.left_size() > 0 ? reinterpret_cast<uintp>(wl.left_begin()->head) : 0;
		if (add(wl.right_begin()->con, o, c)) { dirty.push_left(p); }
		return true;
	}